

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

QString * Mustache::renderTemplate
                    (QString *__return_storage_ptr__,QString *templateString,QVariantHash *args)

{
  QtVariantContext context;
  Renderer renderer;
  QtVariantContext local_f0;
  Renderer local_c8;
  
  ::QVariant::QVariant((QVariant *)&local_c8,(QHash *)args);
  QtVariantContext::QtVariantContext(&local_f0,(QVariant *)&local_c8,(PartialResolver *)0x0);
  ::QVariant::~QVariant((QVariant *)&local_c8);
  Renderer::Renderer(&local_c8);
  Renderer::render(__return_storage_ptr__,&local_c8,templateString,&local_f0.super_Context);
  Renderer::~Renderer(&local_c8);
  QtVariantContext::~QtVariantContext(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

QString Mustache::renderTemplate(const QString& templateString, const QVariantHash& args)
{
	Mustache::QtVariantContext context(args);
	Mustache::Renderer renderer;
	return renderer.render(templateString, &context);
}